

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_link_pg(SAM_hdr *hdr)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  khint_t kVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  SAM_hdr_tag *pSVar12;
  long lVar13;
  
  hdr->npg_end_alloc = hdr->npg;
  piVar6 = (int *)realloc(hdr->pg_end,(long)hdr->npg << 2);
  hdr->pg_end = piVar6;
  if (piVar6 == (int *)0x0) {
    iVar5 = -1;
  }
  else {
    uVar7 = hdr->npg;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      piVar6[uVar10] = (int)uVar10;
    }
    iVar5 = 0;
    for (lVar13 = 0; lVar13 < (int)uVar7; lVar13 = lVar13 + 1) {
      pSVar12 = (SAM_hdr_tag *)&hdr->pg[lVar13].tag;
      do {
        pSVar12 = pSVar12->next;
        iVar9 = iVar5;
        if (pSVar12 == (SAM_hdr_tag *)0x0) goto LAB_0012a56b;
        pcVar3 = pSVar12->str;
      } while ((*pcVar3 != 'P') || (pcVar3[1] != 'P'));
      cVar1 = pcVar3[pSVar12->len];
      pcVar3[pSVar12->len] = '\0';
      pcVar3 = pSVar12->str;
      kVar4 = kh_get_m_s2i(hdr->pg_hash,pcVar3 + 3);
      pcVar3[pSVar12->len] = cVar1;
      iVar9 = -1;
      if (kVar4 != hdr->pg_hash->n_buckets) {
        piVar6 = hdr->pg_hash->vals;
        hdr->pg[lVar13].prev_id = hdr->pg[piVar6[kVar4]].id;
        hdr->pg_end[piVar6[kVar4]] = -1;
        iVar9 = iVar5;
      }
LAB_0012a56b:
      iVar5 = iVar9;
      uVar7 = hdr->npg;
    }
    iVar9 = 0;
    for (lVar13 = 0; lVar13 < (int)uVar7; lVar13 = lVar13 + 1) {
      iVar2 = hdr->pg_end[lVar13];
      if (iVar2 != -1) {
        lVar8 = (long)iVar9;
        iVar9 = iVar9 + 1;
        hdr->pg_end[lVar8] = iVar2;
        uVar7 = hdr->npg;
      }
    }
    hdr->npg_end = iVar9;
  }
  return iVar5;
}

Assistant:

int sam_hdr_link_pg(SAM_hdr *hdr) {
    int i, j, ret = 0;

    hdr->npg_end_alloc = hdr->npg;
    hdr->pg_end = realloc(hdr->pg_end, hdr->npg * sizeof(*hdr->pg_end));
    if (!hdr->pg_end)
	return -1;

    for (i = 0; i < hdr->npg; i++)
	hdr->pg_end[i] = i;

    for (i = 0; i < hdr->npg; i++) {
	khint_t k;
	SAM_hdr_tag *tag;
	char tmp;

	for (tag = hdr->pg[i].tag; tag; tag = tag->next) {
	    if (tag->str[0] == 'P' && tag->str[1] == 'P')
		break;
	}
	if (!tag) {
	    /* Chain start points */
	    continue;
	}

	tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
	k = kh_get(m_s2i, hdr->pg_hash, tag->str+3);
	tag->str[tag->len] = tmp;

	if (k == kh_end(hdr->pg_hash)) {
	    ret = -1;
	    continue;
	}

	hdr->pg[i].prev_id = hdr->pg[kh_val(hdr->pg_hash, k)].id;
	hdr->pg_end[kh_val(hdr->pg_hash, k)] = -1;
    }

    for (i = j = 0; i < hdr->npg; i++) {
	if (hdr->pg_end[i] != -1)
	    hdr->pg_end[j++] = hdr->pg_end[i];
    }
    hdr->npg_end = j;

    return ret;
}